

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSession::IncrementTimestamp(RTPSession *this,uint32_t inc)

{
  uint32_t *puVar1;
  int iVar2;
  
  if (this->created == true) {
    if ((this->packetbuilder).init == true) {
      puVar1 = &(this->packetbuilder).timestamp;
      *puVar1 = *puVar1 + inc;
      return 0;
    }
    iVar2 = -0x14;
  }
  else {
    iVar2 = -0x3e;
  }
  return iVar2;
}

Assistant:

int RTPSession::IncrementTimestamp(uint32_t inc)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = packetbuilder.IncrementTimestamp(inc);
	BUILDER_UNLOCK
	return status;
}